

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  float x1;
  ImGuiNavLayer nav_layer;
  ImGuiID focus_scope_id;
  ImVec2 IVar1;
  ImVec2 p_max;
  ImGuiContext *pIVar2;
  ImGuiID id_00;
  ImU32 fill_col;
  ImGuiWindow *this;
  ImGuiItemFlags extra_flags;
  bool bVar3;
  ImGuiCol local_100;
  float local_f0;
  float local_ec;
  float local_e4;
  float local_dc;
  ImU32 col;
  ImRect IStack_bc;
  bool local_ac;
  bool local_ab;
  bool local_aa;
  byte local_a9;
  uint local_a8;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  bool disabled_global;
  bool item_add;
  float fStack_9c;
  bool disabled_item;
  float backup_clip_rect_max_x;
  float backup_clip_rect_min_x;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  float fStack_58;
  bool span_all_columns;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *size_arg_local;
  ImGuiSelectableFlags flags_local;
  bool selected_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    size = CalcTextSize(label,(char *)0x0,true,-1.0);
    if ((size_arg->x != 0.0) || (NAN(size_arg->x))) {
      local_dc = size_arg->x;
    }
    else {
      local_dc = size.x;
    }
    if ((size_arg->y != 0.0) || (NAN(size_arg->y))) {
      local_e4 = size_arg->y;
    }
    else {
      local_e4 = size.y;
    }
    ImVec2::ImVec2(&pos,local_dc,local_e4);
    IVar1 = (this->DC).CursorPos;
    fStack_58 = IVar1.y;
    fStack_58 = (this->DC).CurrLineTextBaseOffset + fStack_58;
    min_x = IVar1.x;
    x1 = min_x;
    ItemSize(&pos,0.0);
    bVar3 = (flags & 2U) != 0;
    if (bVar3) {
      x1 = (this->ParentWorkRect).Min.x;
      local_ec = (this->ParentWorkRect).Max.x;
    }
    else {
      local_ec = (this->WorkRect).Max.x;
    }
    if (((size_arg->x == 0.0) && (!NAN(size_arg->x))) || ((flags & 0x1000000U) != 0)) {
      pos.x = ImMax<float>(size.x,local_ec - x1);
    }
    text_max = _min_x;
    ImVec2::ImVec2(&bb.Max,x1 + pos.x,fStack_58 + pos.y);
    ImRect::ImRect((ImRect *)&spacing_y,x1,fStack_58,bb.Max.x,bb.Max.y);
    if ((flags & 0x8000000U) == 0) {
      if (bVar3) {
        local_f0 = 0.0;
      }
      else {
        local_f0 = (pIVar2->Style).ItemSpacing.x;
      }
      spacing_L = local_f0;
      spacing_U = (pIVar2->Style).ItemSpacing.y;
      backup_clip_rect_min_x = (float)(int)(local_f0 * 0.5);
      backup_clip_rect_max_x = (float)(int)(spacing_U * 0.5);
      spacing_y = spacing_y - backup_clip_rect_min_x;
      spacing_x = spacing_x - backup_clip_rect_max_x;
      bb.Min.x = (local_f0 - backup_clip_rect_min_x) + bb.Min.x;
      bb.Min.y = (spacing_U - backup_clip_rect_max_x) + bb.Min.y;
    }
    fStack_9c = (this->ClipRect).Min.x;
    button_flags = (ImGuiButtonFlags)(this->ClipRect).Max.x;
    if (bVar3) {
      (this->ClipRect).Min.x = (this->ParentWorkRect).Min.x;
      (this->ClipRect).Max.x = (this->ParentWorkRect).Max.x;
    }
    was_selected = (flags & 8U) != 0;
    extra_flags = 0;
    if (was_selected) {
      extra_flags = 4;
    }
    hovered = ItemAdd((ImRect *)&spacing_y,id_00,(ImRect *)0x0,extra_flags);
    if (bVar3) {
      (this->ClipRect).Min.x = fStack_9c;
      (this->ClipRect).Max.x = (float)button_flags;
    }
    if (hovered) {
      held = (pIVar2->CurrentItemFlags & 4U) != 0;
      if (((was_selected & 1U) != 0) && (!held)) {
        BeginDisabled(true);
      }
      if ((bVar3) && ((this->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PushColumnsBackground();
      }
      else if ((bVar3) && (pIVar2->CurrentTable != (ImGuiTable *)0x0)) {
        TablePushBackgroundChannel();
      }
      local_a8 = 0;
      if ((flags & 0x100000U) != 0) {
        local_a8 = 0x20000;
      }
      if ((flags & 0x400000U) != 0) {
        local_a8 = local_a8 | 0x10;
      }
      if ((flags & 0x800000U) != 0) {
        local_a8 = local_a8 | 0x80;
      }
      if ((flags & 4U) != 0) {
        local_a8 = local_a8 | 0x120;
      }
      if ((flags & 0x10U) != 0) {
        local_a8 = local_a8 | 0x1000;
      }
      local_a9 = selected;
      local_ac = ButtonBehavior((ImRect *)&spacing_y,id_00,&local_aa,&local_ab,local_a8);
      size_arg_local._7_1_ = selected;
      if (((((flags & 0x200000U) != 0) && (pIVar2->NavJustMovedToId != 0)) &&
          (pIVar2->NavJustMovedToFocusScopeId == (this->DC).NavFocusScopeIdCurrent)) &&
         (pIVar2->NavJustMovedToId == id_00)) {
        local_ac = true;
        size_arg_local._7_1_ = 1;
      }
      if ((((local_ac != false) || (((local_aa & 1U) != 0 && ((flags & 0x4000000U) != 0)))) &&
          ((pIVar2->NavDisableMouseHover & 1U) == 0)) &&
         ((pIVar2->NavWindow == this && (pIVar2->NavLayer == (this->DC).NavLayerCurrent)))) {
        nav_layer = (this->DC).NavLayerCurrent;
        focus_scope_id = (this->DC).NavFocusScopeIdCurrent;
        IStack_bc = WindowRectAbsToRel(this,(ImRect *)&spacing_y);
        SetNavID(id_00,nav_layer,focus_scope_id,&stack0xffffffffffffff44);
        pIVar2->NavDisableHighlight = true;
      }
      if ((local_ac & 1U) != 0) {
        MarkItemEdited(id_00);
      }
      if ((flags & 0x10U) != 0) {
        SetItemAllowOverlap();
      }
      if ((size_arg_local._7_1_ & 1) != (local_a9 & 1)) {
        (pIVar2->LastItemData).StatusFlags = (pIVar2->LastItemData).StatusFlags | 8;
      }
      if (((local_ab & 1U) != 0) && ((flags & 0x2000000U) != 0)) {
        local_aa = true;
      }
      if (((local_aa & 1U) != 0) || ((size_arg_local._7_1_ & 1) != 0)) {
        if (((local_ab & 1U) == 0) || ((local_aa & 1U) == 0)) {
          local_100 = 0x18;
          if ((local_aa & 1U) != 0) {
            local_100 = 0x19;
          }
        }
        else {
          local_100 = 0x1a;
        }
        fill_col = GetColorU32(local_100,1.0);
        IVar1.y = spacing_x;
        IVar1.x = spacing_y;
        p_max.y = bb.Min.y;
        p_max.x = bb.Min.x;
        RenderFrame(IVar1,p_max,fill_col,false,0.0);
      }
      RenderNavHighlight((ImRect *)&spacing_y,id_00,10);
      if ((bVar3) && ((this->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PopColumnsBackground();
      }
      else if ((bVar3) && (pIVar2->CurrentTable != (ImGuiTable *)0x0)) {
        TablePopBackgroundChannel();
      }
      RenderTextClipped(&text_max,&bb.Max,label,(char *)0x0,&size,
                        &(pIVar2->Style).SelectableTextAlign,(ImRect *)&spacing_y);
      if (((((local_ac & 1U) != 0) && ((this->Flags & 0x4000000U) != 0)) && ((flags & 1U) == 0)) &&
         (((pIVar2->LastItemData).InFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
      if (((was_selected & 1U) != 0) && ((held & 1U) == 0)) {
        EndDisabled();
      }
      label_local._7_1_ = (bool)(local_ac & 1);
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    // We don't support (size < 0.0f) in Selectable() because the ItemSpacing extension would make explicitly right-aligned sizes not visibly match other widgets.
    const bool span_all_columns = (flags & ImGuiSelectableFlags_SpanAllColumns) != 0;
    const float min_x = span_all_columns ? window->ParentWorkRect.Min.x : pos.x;
    const float max_x = span_all_columns ? window->ParentWorkRect.Max.x : window->WorkRect.Max.x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb(min_x, pos.y, text_max.x, text_max.y);
    if ((flags & ImGuiSelectableFlags_NoPadWithHalfSpacing) == 0)
    {
        const float spacing_x = span_all_columns ? 0.0f : style.ItemSpacing.x;
        const float spacing_y = style.ItemSpacing.y;
        const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
        const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
        bb.Min.x -= spacing_L;
        bb.Min.y -= spacing_U;
        bb.Max.x += (spacing_x - spacing_L);
        bb.Max.y += (spacing_y - spacing_U);
    }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(0, 255, 0, 255)); }

    // Modify ClipRect for the ItemAdd(), faster than doing a PushColumnsBackground/PushTableBackground for every Selectable..
    const float backup_clip_rect_min_x = window->ClipRect.Min.x;
    const float backup_clip_rect_max_x = window->ClipRect.Max.x;
    if (span_all_columns)
    {
        window->ClipRect.Min.x = window->ParentWorkRect.Min.x;
        window->ClipRect.Max.x = window->ParentWorkRect.Max.x;
    }

    const bool disabled_item = (flags & ImGuiSelectableFlags_Disabled) != 0;
    const bool item_add = ItemAdd(bb, id, NULL, disabled_item ? ImGuiItemFlags_Disabled : ImGuiItemFlags_None);
    if (span_all_columns)
    {
        window->ClipRect.Min.x = backup_clip_rect_min_x;
        window->ClipRect.Max.x = backup_clip_rect_max_x;
    }

    if (!item_add)
        return false;

    const bool disabled_global = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (disabled_item && !disabled_global) // Only testing this as an optimization
        BeginDisabled();

    // FIXME: We can standardize the behavior of those two, we could also keep the fast path of override ClipRect + full push on render only,
    // which would be advantageous since most selectable are not selected.
    if (span_all_columns && window->DC.CurrentColumns)
        PushColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePushBackgroundChannel();

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);

    // Auto-select when moved into
    // - This will be more fully fleshed in the range-select branch
    // - This is not exposed as it won't nicely work with some user side handling of shift/control
    // - We cannot do 'if (g.NavJustMovedToId != id) { selected = false; pressed = was_selected; }' for two reasons
    //   - (1) it would require focus scope to be set, need exposing PushFocusScope() or equivalent (e.g. BeginSelection() calling PushFocusScope())
    //   - (2) usage will fail with clipped items
    //   The multi-select API aim to fix those issues, e.g. may be replaced with a BeginSelection() API.
    if ((flags & ImGuiSelectableFlags_SelectOnNav) && g.NavJustMovedToId != 0 && g.NavJustMovedToFocusScopeId == window->DC.NavFocusScopeIdCurrent)
        if (g.NavJustMovedToId == id)
            selected = pressed = true;

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            SetNavID(id, window->DC.NavLayerCurrent, window->DC.NavFocusScopeIdCurrent, WindowRectAbsToRel(window, bb)); // (bb == NavRect)
            g.NavDisableHighlight = true;
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);

    if (span_all_columns && window->DC.CurrentColumns)
        PopColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePopBackgroundChannel();

    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb);

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(g.LastItemData.InFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    if (disabled_item && !disabled_global)
        EndDisabled();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed; //-V1020
}